

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintThreeBBShaft>::create
          (ChClassRegistration<chrono::ChConstraintThreeBBShaft> *this)

{
  type pvVar1;
  
  pvVar1 = _create<chrono::ChConstraintThreeBBShaft>(this);
  return pvVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }